

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Derive.cpp
# Opt level: O2

void __thiscall
amrex::DeriveList::add
          (DeriveList *this,string *name,IndexType res_typ,int nvar_der,
          Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *vars,DeriveFuncFab *der_func_fab,DeriveBoxMap bx_map,Interpolater *interp)

{
  function<void_(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::FArrayBox_&,_const_amrex::Geometry_&,_double,_const_int_*,_int)>
  local_f0;
  DeriveRec local_d0;
  
  std::
  function<void_(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::FArrayBox_&,_const_amrex::Geometry_&,_double,_const_int_*,_int)>
  ::function(&local_f0,der_func_fab);
  DeriveRec::DeriveRec(&local_d0,name,res_typ,nvar_der,vars,&local_f0,bx_map,interp);
  std::__cxx11::list<amrex::DeriveRec,_std::allocator<amrex::DeriveRec>_>::push_back
            (&this->lst,&local_d0);
  DeriveRec::~DeriveRec(&local_d0);
  std::_Function_base::~_Function_base(&local_f0.super__Function_base);
  return;
}

Assistant:

void
DeriveList::add (const std::string&      name,
                 IndexType               res_typ,
                 int                     nvar_der,
                 Vector<std::string> const&    vars,
                 DeriveFuncFab           der_func_fab,
                 DeriveRec::DeriveBoxMap bx_map,
                 Interpolater*           interp)
{
    lst.push_back(DeriveRec(name,res_typ,nvar_der,vars,der_func_fab,bx_map,interp));
}